

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

void QDir::setSearchPaths(QString *prefix,QStringList *searchPaths)

{
  ushort uVar1;
  ulong uVar2;
  char16_t *pcVar3;
  bool bVar4;
  Type *pTVar5;
  QString *__range1;
  char *msg;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_> *this;
  long lVar6;
  long in_FS_OFFSET;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (prefix->d).size;
  if (uVar2 < 2) {
    msg = "QDir::setSearchPaths: Prefix must be longer than 1 character";
  }
  else {
    pcVar3 = (prefix->d).ptr;
    lVar6 = 0;
    this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_> *)
           prefix;
    do {
      if (uVar2 * 2 == lVar6) {
        pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>
                 ::operator*(this);
        local_50.context.version = (int)pTVar5;
        local_50.context.line = (int)((ulong)pTVar5 >> 0x20);
        QWriteLocker::relock((QWriteLocker *)&local_50);
        if ((searchPaths->d).size == 0) {
          QHash<QString,_QList<QString>_>::removeImpl<QString>(&pTVar5->paths,prefix);
        }
        else {
          QHash<QString,QList<QString>>::emplace<QList<QString>const&>
                    ((QHash<QString,QList<QString>> *)&pTVar5->paths,prefix,searchPaths);
        }
        QWriteLocker::~QWriteLocker((QWriteLocker *)&local_50);
        goto LAB_00212b58;
      }
      uVar1 = *(ushort *)((long)pcVar3 + lVar6);
      this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_> *)
             (ulong)uVar1;
      bVar4 = QChar::isLetterOrNumber((uint)uVar1);
      lVar6 = lVar6 + 2;
    } while (bVar4);
    msg = "QDir::setSearchPaths: Prefix can only contain letters or numbers";
  }
  local_50.context.category = "default";
  local_50.context.function._4_4_ = 0;
  local_50.context._12_8_ = 0;
  local_50.context.file._0_4_ = 0;
  local_50.context.line = 0;
  local_50.context.version = 2;
  QMessageLogger::warning(&local_50,msg);
LAB_00212b58:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDir::setSearchPaths(const QString &prefix, const QStringList &searchPaths)
{
    if (prefix.size() < 2) {
        qWarning("QDir::setSearchPaths: Prefix must be longer than 1 character");
        return;
    }

    for (QChar ch : prefix) {
        if (!ch.isLetterOrNumber()) {
            qWarning("QDir::setSearchPaths: Prefix can only contain letters or numbers");
            return;
        }
    }

    DirSearchPaths &conf = *dirSearchPaths;
    const QWriteLocker lock(&conf.mutex);
    if (searchPaths.isEmpty()) {
        conf.paths.remove(prefix);
    } else {
        conf.paths.insert(prefix, searchPaths);
    }
}